

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O2

void __thiscall
DConversationMenu::DConversationMenu
          (DConversationMenu *this,FStrifeDialogueNode *CurNode,player_t *player)

{
  uint uVar1;
  ulong uVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  BYTE *__s1;
  FBrokenLines *pFVar7;
  char *pcVar8;
  BYTE *string;
  char *copyStr;
  FStrifeDialogueReply *reply;
  FString *item;
  FString dlgtext;
  uint local_44;
  FStrifeDialogueNode *local_40;
  char *local_38;
  
  DMenu::DMenu(&this->super_DMenu,(DMenu *)0x0);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006f2790;
  (this->mSpeaker).Chars = FString::NullString.Nothing;
  iVar6 = FString::NullString.RefCount;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->mResponses).Array = (uint *)0x0;
  (this->mResponses).Most = 0;
  (this->mResponses).Count = 0;
  (this->mResponseLines).Array = (FString *)0x0;
  (this->mResponseLines).Most = 0;
  (this->mResponseLines).Count = 0;
  this->mCurNode = CurNode;
  this->mPlayer = player;
  this->mDialogueLines = (FBrokenLines *)0x0;
  this->mShowGold = false;
  __s1 = (BYTE *)CurNode->Dialogue;
  local_40 = CurNode;
  iVar5 = strncmp((char *)__s1,"RANDOM_",7);
  local_38 = FString::NullString.Nothing;
  if (iVar5 == 0) {
    dlgtext.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = iVar6 + 2;
    iVar6 = FRandom::operator()(&pr_randomspeech);
    FString::Format(&dlgtext,"TXT_%s_%02d",__s1,(ulong)(iVar6 % 10 + 1));
    __s1 = (BYTE *)FStringTable::operator[](&GStrings,dlgtext.Chars);
    if (__s1 == (BYTE *)0x0) {
      __s1 = (BYTE *)FStringTable::operator[](&GStrings,"TXT_GOAWAY");
    }
    FString::~FString(&dlgtext);
  }
  else if (*__s1 == '$') {
    __s1 = (BYTE *)FStringTable::operator()(&GStrings,(char *)(__s1 + 1));
  }
  string = ".";
  if (__s1 != (BYTE *)0x0) {
    string = __s1;
  }
  pFVar7 = V_BreakLines(SmallFont,
                        (screen->super_DSimpleCanvas).super_DCanvas.Width / CleanXfac + -0x30,string
                        ,false);
  this->mDialogueLines = pFVar7;
  reply = (FStrifeDialogueReply *)&local_40->Children;
  while (reply = reply->Next, reply != (FStrifeDialogueReply *)0x0) {
    bVar4 = ShouldSkipReply(reply,this->mPlayer);
    if (!bVar4) {
      this->mShowGold = (bool)(this->mShowGold | reply->NeedsGold);
      pcVar8 = reply->Reply;
      if (*pcVar8 == '$') {
        pcVar8 = FStringTable::operator()(&GStrings,pcVar8 + 1);
      }
      FString::FString(&dlgtext,pcVar8);
      if (reply->NeedsGold == true) {
        FString::AppendFormat(&dlgtext," for %u",(ulong)(uint)((reply->ItemCheck).Array)->Amount);
      }
      pFVar7 = V_BreakLines(SmallFont,0x104,(BYTE *)dlgtext.Chars,false);
      local_44 = (this->mResponseLines).Count;
      TArray<unsigned_int,_unsigned_int>::Push(&this->mResponses,&local_44);
      for (item = &pFVar7->Text; -1 < ((FBrokenLines *)(item + -1))->Width; item = item + 2) {
        TArray<FString,_FString>::Push(&this->mResponseLines,item);
      }
      V_FreeBrokenLines(pFVar7);
      FString::~FString(&dlgtext);
    }
  }
  pcVar8 = local_40->Goodbye;
  if (pcVar8 == (char *)0x0) {
    iVar6 = FRandom::operator()(&pr_randomspeech);
    mysnprintf((char *)&dlgtext,0x19,"TXT_RANDOMGOODBYE_%d",(ulong)(iVar6 % 3 + 1));
    pcVar8 = FStringTable::operator[](&GStrings,(char *)&dlgtext);
  }
  else {
    iVar6 = strncmp(pcVar8,"RANDOM_",7);
    if (iVar6 == 0) {
      dlgtext.Chars = local_38;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      iVar6 = FRandom::operator()(&pr_randomspeech);
      FString::Format(&dlgtext,"TXT_%s_%02d",pcVar8,(ulong)(iVar6 % 10 + 1));
      pcVar8 = FStringTable::operator[](&GStrings,dlgtext.Chars);
      FString::~FString(&dlgtext);
    }
    else if (*pcVar8 == '$') {
      pcVar8 = FStringTable::operator()(&GStrings,pcVar8 + 1);
    }
  }
  dlgtext.Chars._0_4_ = (this->mResponseLines).Count;
  TArray<unsigned_int,_unsigned_int>::Push(&this->mResponses,(uint *)&dlgtext);
  copyStr = "Bye.";
  if (pcVar8 != (char *)0x0) {
    copyStr = pcVar8;
  }
  FString::FString(&dlgtext,copyStr);
  TArray<FString,_FString>::Push(&this->mResponseLines,&dlgtext);
  FString::~FString(&dlgtext);
  ConversationMenuY = 0xc0 - (this->mResponseLines).Count * OptionSettings.mLinespacing;
  if (0x8b < ConversationMenuY) {
    ConversationMenuY = 0x8c;
  }
  this->mYpos = ConversationMenuY;
  pFVar7 = this->mDialogueLines;
  iVar6 = 0x86;
  do {
    iVar6 = iVar6 + 10;
    piVar3 = &pFVar7->Width;
    pFVar7 = pFVar7 + 1;
  } while (-1 < *piVar3);
  uVar2 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)CleanYfac;
  iVar5 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / -2);
  if (ConversationMenuY + -100 < iVar5 + iVar6 + -100) {
    ConversationMenuY = iVar5 + iVar6;
    this->mYpos = ConversationMenuY;
  }
  uVar1 = (this->mResponses).Count;
  if ((int)uVar1 <= mSelection) {
    mSelection = uVar1 - 1;
  }
  return;
}

Assistant:

DConversationMenu(FStrifeDialogueNode *CurNode, player_t *player)
	{
		mCurNode = CurNode;
		mPlayer = player;
		mDialogueLines = NULL;
		mShowGold = false;

		// Format the speaker's message.
		const char * toSay = CurNode->Dialogue;
		if (strncmp (toSay, "RANDOM_", 7) == 0)
		{
			FString dlgtext;

			dlgtext.Format("TXT_%s_%02d", toSay, 1+(pr_randomspeech() % NUM_RANDOM_LINES));
			toSay = GStrings[dlgtext];
			if (toSay == NULL)
			{
				toSay = GStrings["TXT_GOAWAY"];	// Ok, it's lame - but it doesn't look like an error to the player. ;)
			}
		}
		else
		{
			// handle string table replacement
			if (toSay[0] == '$')
			{
				toSay = GStrings(toSay + 1);
			}
		}
		if (toSay == NULL)
		{
			toSay = ".";
		}
		mDialogueLines = V_BreakLines (SmallFont, screen->GetWidth()/CleanXfac - 24*2, toSay);

		FStrifeDialogueReply *reply;
		int i,j;
		for (reply = CurNode->Children, i = 1; reply != NULL; reply = reply->Next)
		{
			if (ShouldSkipReply(reply, mPlayer))
			{
				continue;
			}
			mShowGold |= reply->NeedsGold;

			const char *ReplyText = reply->Reply;
			if (ReplyText[0] == '$')
			{
				ReplyText = GStrings(ReplyText + 1);
			}
			FString ReplyString = ReplyText;
			if (reply->NeedsGold) ReplyString.AppendFormat(" for %u", reply->ItemCheck[0].Amount);

			FBrokenLines *ReplyLines = V_BreakLines (SmallFont, 320-50-10, ReplyString);

			mResponses.Push(mResponseLines.Size());
			for (j = 0; ReplyLines[j].Width >= 0; ++j)
			{
				mResponseLines.Push(ReplyLines[j].Text);
			}
			++i;
			V_FreeBrokenLines (ReplyLines);
		}
		const char *goodbyestr = CurNode->Goodbye;
		if (goodbyestr == nullptr)
		{
			char goodbye[25];
			mysnprintf(goodbye, countof(goodbye), "TXT_RANDOMGOODBYE_%d", 1 + (pr_randomspeech() % NUM_RANDOM_GOODBYES));
			goodbyestr = GStrings[goodbye];
		}
		else if (strncmp(goodbyestr, "RANDOM_", 7) == 0)
		{
			FString byetext;

			byetext.Format("TXT_%s_%02d", goodbyestr, 1 + (pr_randomspeech() % NUM_RANDOM_LINES));
			goodbyestr = GStrings[byetext];
		}
		else if (goodbyestr[0] == '$')
		{
			goodbyestr = GStrings(goodbyestr + 1);
		}
		if (goodbyestr == nullptr) goodbyestr = "Bye.";
		mResponses.Push(mResponseLines.Size());
		mResponseLines.Push(FString(goodbyestr));

		// Determine where the top of the reply list should be positioned.
		i = OptionSettings.mLinespacing;
		mYpos = MIN<int> (140, 192 - mResponseLines.Size() * i);
		for (i = 0; mDialogueLines[i].Width >= 0; ++i)
		{ }
		i = 44 + i * 10;
		if (mYpos - 100 < i - screen->GetHeight() / CleanYfac / 2)
		{
			mYpos = i - screen->GetHeight() / CleanYfac / 2 + 100;
		}
		ConversationMenuY = mYpos;
		//ConversationMenu.indent = 50;

		// Because replies can be selectively hidden mResponses.Size() won't be consistent.
		// So make sure mSelection doesn't exceed mResponses.Size(). [FishyClockwork]
		if (mSelection >= (int)mResponses.Size())
		{
			mSelection = mResponses.Size() - 1;
		}
	}